

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

vector<void_*,_std::allocator<void_*>_> * __thiscall
google::protobuf::internal::ThreadSafeArena::PeekCleanupListForTesting
          (vector<void_*,_std::allocator<void_*>_> *__return_storage_ptr__,ThreadSafeArena *this)

{
  SerialArena *this_00;
  ThreadSafeArena *this_local;
  
  this_00 = GetSerialArena(this);
  SerialArena::PeekCleanupListForTesting(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

std::vector<void*> ThreadSafeArena::PeekCleanupListForTesting() {
  return GetSerialArena()->PeekCleanupListForTesting();
}